

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

mchunkptr try_realloc_chunk(mstate m,mchunkptr p,size_t nb,int can_move)

{
  tbinptr pmVar1;
  size_t __old_len;
  char *pcVar2;
  byte *pbVar3;
  uint uVar4;
  malloc_tree_chunk *pmVar5;
  ulong uVar6;
  malloc_tree_chunk *pmVar7;
  tbinptr pmVar8;
  tbinptr pmVar9;
  byte bVar10;
  size_t sVar11;
  char *pcVar12;
  ulong uVar13;
  malloc_tree_chunk *pmVar14;
  mchunkptr pmVar15;
  tbinptr pmVar16;
  uint uVar17;
  size_t newsize;
  size_t newsize_1;
  ulong uVar18;
  
  pmVar5 = (malloc_tree_chunk *)m->least_addr;
  if (p < pmVar5) goto LAB_00137b23;
  uVar13 = p->head;
  uVar17 = (uint)uVar13;
  if (((uVar17 & 3) == 1) || (uVar18 = uVar13 & 0xfffffffffffffff8, (long)uVar18 < 1))
  goto LAB_00137b23;
  pmVar1 = (tbinptr)((long)&p->prev_foot + uVar18);
  uVar6 = pmVar1->head;
  if ((uVar6 & 1) == 0) goto LAB_00137b23;
  if ((uVar13 & 3) == 0) {
    if (nb < 0x100) {
      return (mchunkptr)0x0;
    }
    if ((nb + 8 <= uVar18) && (uVar18 - nb <= mparams.granularity * 2)) {
      return p;
    }
    sVar11 = p->prev_foot;
    __old_len = uVar18 + 0x20 + sVar11;
    uVar13 = -mparams.page_size & nb + 0x3e + mparams.page_size;
    pcVar12 = (char *)mremap((void *)((long)p - sVar11),__old_len,uVar13,can_move);
    if (pcVar12 == (char *)0xffffffffffffffff) {
      return (mchunkptr)0x0;
    }
    pmVar15 = (mchunkptr)(pcVar12 + sVar11);
    *(ulong *)(pcVar12 + sVar11 + 8) = (uVar13 - sVar11) + -0x20;
    *(undefined8 *)((uVar13 - sVar11) + -0x18 + (long)pmVar15) = 0xb;
    pcVar2 = pcVar12 + (uVar13 - 0x10);
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    if (pcVar12 < m->least_addr) {
      m->least_addr = pcVar12;
    }
    uVar13 = (uVar13 - __old_len) + m->footprint;
    m->footprint = uVar13;
    if (m->max_footprint < uVar13) {
      m->max_footprint = uVar13;
      return pmVar15;
    }
    return pmVar15;
  }
  sVar11 = uVar18 - nb;
  if (nb <= uVar18) {
    if (sVar11 < 0x20) {
      return p;
    }
    p->head = uVar17 & 1 | nb | 2;
    *(size_t *)((long)&p->head + nb) = sVar11 | 3;
    *(byte *)&pmVar1->head = (byte)pmVar1->head | 1;
    goto LAB_0013790b;
  }
  if (pmVar1 == (tbinptr)m->top) {
    uVar18 = uVar18 + m->topsize;
    uVar13 = uVar18 - nb;
    if (uVar18 < nb || uVar13 == 0) {
      return (mchunkptr)0x0;
    }
    p->head = uVar17 & 1 | nb | 2;
    *(ulong *)((long)&p->head + nb) = uVar13 | 1;
    m->top = (mchunkptr)((long)&p->prev_foot + nb);
    m->topsize = uVar13;
    return p;
  }
  if (pmVar1 == (tbinptr)m->dv) {
    uVar18 = uVar18 + m->dvsize;
    uVar13 = uVar18 - nb;
    if (uVar18 < nb) {
      return (mchunkptr)0x0;
    }
    if (uVar13 < 0x20) {
      p->head = uVar17 & 1 | uVar18 | 2;
      pbVar3 = (byte *)((long)&p->head + uVar18);
      *pbVar3 = *pbVar3 | 1;
      uVar13 = 0;
      pmVar15 = (mchunkptr)0x0;
    }
    else {
      pmVar15 = (mchunkptr)((long)&p->prev_foot + nb);
      p->head = uVar17 & 1 | nb | 2;
      *(ulong *)((long)&p->head + nb) = uVar13 | 1;
      *(ulong *)((long)&p->prev_foot + uVar18) = uVar13;
      pbVar3 = (byte *)((long)&p->head + uVar18);
      *pbVar3 = *pbVar3 & 0xfe;
    }
    m->dvsize = uVar13;
    m->dv = pmVar15;
    return p;
  }
  if ((uVar6 & 2) != 0) {
    return (mchunkptr)0x0;
  }
  uVar18 = (uVar6 & 0xfffffffffffffff8) + uVar18;
  sVar11 = uVar18 - nb;
  if (uVar18 < nb) {
    return (mchunkptr)0x0;
  }
  if (0xff < uVar6) {
    pmVar16 = pmVar1->bk;
    pmVar7 = pmVar1->child[2];
    if (pmVar16 == pmVar1) {
      pmVar16 = pmVar1->child[1];
      if (pmVar16 != (tbinptr)0x0) {
        pmVar14 = (malloc_tree_chunk *)(pmVar1->child + 1);
LAB_00137a2d:
        do {
          if (pmVar16->child[1] == (malloc_tree_chunk *)0x0) {
            if (pmVar16->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00137a41;
            pmVar14 = (malloc_tree_chunk *)pmVar16->child;
          }
          else {
            pmVar14 = (malloc_tree_chunk *)(pmVar16->child + 1);
          }
          pmVar16 = (tbinptr)pmVar14->prev_foot;
        } while( true );
      }
      pmVar16 = pmVar1->child[0];
      if (pmVar16 != (tbinptr)0x0) {
        pmVar14 = (malloc_tree_chunk *)pmVar1->child;
        goto LAB_00137a2d;
      }
      pmVar16 = (tbinptr)0x0;
    }
    else {
      pmVar14 = pmVar1->fd;
      if (((pmVar14 < pmVar5) || (pmVar14->bk != pmVar1)) || (pmVar16->fd != pmVar1))
      goto LAB_00137b23;
      pmVar14->bk = pmVar16;
      pmVar16->fd = pmVar14;
    }
    goto LAB_00137a51;
  }
  pmVar7 = pmVar1->fd;
  pmVar14 = pmVar1->bk;
  if ((pmVar7 != (malloc_tree_chunk *)(m->smallbins + (uVar6 >> 3) * 2)) &&
     ((pmVar7 < pmVar5 || (pmVar7->bk != pmVar1)))) goto LAB_00137b23;
  if (pmVar14 == pmVar7) {
    bVar10 = (byte)(uVar6 >> 3) & 0x1f;
    m->smallmap = m->smallmap & (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
  }
  else {
    if ((pmVar14 != (malloc_tree_chunk *)(m->smallbins + (uVar6 >> 3) * 2)) &&
       ((pmVar14 < pmVar5 || (pmVar14->fd != pmVar1)))) goto LAB_00137b23;
    pmVar7->bk = pmVar14;
    pmVar14->fd = pmVar7;
  }
  goto LAB_00137add;
code_r0x00137a41:
  if (pmVar14 < pmVar5) goto LAB_00137b23;
  pmVar14->prev_foot = 0;
LAB_00137a51:
  if (pmVar7 != (malloc_tree_chunk *)0x0) {
    uVar4 = *(uint *)(pmVar1->child + 3);
    if (pmVar1 == m->treebins[uVar4]) {
      m->treebins[uVar4] = pmVar16;
      if (pmVar16 == (tbinptr)0x0) {
        bVar10 = (byte)uVar4 & 0x1f;
        m->treemap = m->treemap & (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
        goto LAB_00137a9e;
      }
    }
    else {
      if (pmVar7 < (malloc_tree_chunk *)m->least_addr) goto LAB_00137b23;
      if (pmVar7->child[0] == pmVar1) {
        pmVar7->child[0] = pmVar16;
      }
      else {
        pmVar7->child[1] = pmVar16;
      }
LAB_00137a9e:
      if (pmVar16 == (tbinptr)0x0) goto LAB_00137add;
    }
    pmVar8 = (tbinptr)m->least_addr;
    if (pmVar16 < pmVar8) {
LAB_00137b23:
      abort();
    }
    pmVar16->child[2] = pmVar7;
    pmVar9 = pmVar1->child[0];
    if (pmVar9 != (tbinptr)0x0) {
      if (pmVar9 < pmVar8) goto LAB_00137b23;
      pmVar16->child[0] = pmVar9;
      pmVar9->child[2] = pmVar16;
    }
    pmVar5 = pmVar1->child[1];
    if (pmVar5 != (malloc_tree_chunk *)0x0) {
      if (pmVar5 < (malloc_tree_chunk *)m->least_addr) goto LAB_00137b23;
      pmVar16->child[1] = pmVar5;
      pmVar5->parent = pmVar16;
    }
  }
LAB_00137add:
  if (sVar11 < 0x20) {
    p->head = (ulong)(uVar17 & 1) + 2 + uVar18;
    pbVar3 = (byte *)((long)&p->head + uVar18);
    *pbVar3 = *pbVar3 | 1;
    return p;
  }
  p->head = uVar17 & 1 | nb | 2;
  *(size_t *)((long)&p->head + nb) = sVar11 | 3;
  pbVar3 = (byte *)((long)&p->head + uVar18);
  *pbVar3 = *pbVar3 | 1;
LAB_0013790b:
  dispose_chunk(m,(mchunkptr)((long)&p->prev_foot + nb),sVar11);
  return p;
}

Assistant:

static mchunkptr try_realloc_chunk(mstate m, mchunkptr p, size_t nb,
                                   int can_move) {
  mchunkptr newp = 0;
  size_t oldsize = chunksize(p);
  mchunkptr next = chunk_plus_offset(p, oldsize);
  if (RTCHECK(ok_address(m, p) && ok_inuse(p) &&
              ok_next(p, next) && ok_pinuse(next))) {
    if (is_mmapped(p)) {
      newp = mmap_resize(m, p, nb, can_move);
    }
    else if (oldsize >= nb) {             /* already big enough */
      size_t rsize = oldsize - nb;
      if (rsize >= MIN_CHUNK_SIZE) {      /* split off remainder */
        mchunkptr r = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        set_inuse(m, r, rsize);
        dispose_chunk(m, r, rsize);
      }
      newp = p;
    }
    else if (next == m->top) {  /* extend into top */
      if (oldsize + m->topsize > nb) {
        size_t newsize = oldsize + m->topsize;
        size_t newtopsize = newsize - nb;
        mchunkptr newtop = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        newtop->head = newtopsize |PINUSE_BIT;
        m->top = newtop;
        m->topsize = newtopsize;
        newp = p;
      }
    }
    else if (next == m->dv) { /* extend into dv */
      size_t dvs = m->dvsize;
      if (oldsize + dvs >= nb) {
        size_t dsize = oldsize + dvs - nb;
        if (dsize >= MIN_CHUNK_SIZE) {
          mchunkptr r = chunk_plus_offset(p, nb);
          mchunkptr n = chunk_plus_offset(r, dsize);
          set_inuse(m, p, nb);
          set_size_and_pinuse_of_free_chunk(r, dsize);
          clear_pinuse(n);
          m->dvsize = dsize;
          m->dv = r;
        }
        else { /* exhaust dv */
          size_t newsize = oldsize + dvs;
          set_inuse(m, p, newsize);
          m->dvsize = 0;
          m->dv = 0;
        }
        newp = p;
      }
    }
    else if (!cinuse(next)) { /* extend into next free chunk */
      size_t nextsize = chunksize(next);
      if (oldsize + nextsize >= nb) {
        size_t rsize = oldsize + nextsize - nb;
        unlink_chunk(m, next, nextsize);
        if (rsize < MIN_CHUNK_SIZE) {
          size_t newsize = oldsize + nextsize;
          set_inuse(m, p, newsize);
        }
        else {
          mchunkptr r = chunk_plus_offset(p, nb);
          set_inuse(m, p, nb);
          set_inuse(m, r, rsize);
          dispose_chunk(m, r, rsize);
        }
        newp = p;
      }
    }
  }
  else {
    USAGE_ERROR_ACTION(m, chunk2mem(p));
  }
  return newp;
}